

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall
CDirectiveHeaderSize::CDirectiveHeaderSize(CDirectiveHeaderSize *this,ArgumentList *args)

{
  bool bVar1;
  Entry *pEVar2;
  ArgumentList *args_local;
  CDirectiveHeaderSize *this_local;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveHeaderSize_001f2ca0;
  pEVar2 = ArgumentList::operator[](args,0);
  bVar1 = ConvertExpression(&pEVar2->text,&this->headerSize);
  if (!bVar1) {
    pEVar2 = ArgumentList::operator[](args,0);
    Logger::printError<std::__cxx11::wstring>(FatalError,L"Invalid header size %s",&pEVar2->text);
  }
  updateFile(this);
  return;
}

Assistant:

CDirectiveHeaderSize::CDirectiveHeaderSize(ArgumentList& args)
{
	if (ConvertExpression(args[0].text,headerSize) == false)
	{
		Logger::printError(Logger::FatalError,L"Invalid header size %s",args[0].text);
	}

	updateFile();
}